

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

size_t itemUsage(FILE *fp,columns_t columns,poptItem item,int nitems,char *translation_domain)

{
  size_t sVar1;
  poptOption *opt;
  char *pcStack_30;
  int i;
  char *translation_domain_local;
  poptItem ppStack_20;
  int nitems_local;
  poptItem item_local;
  columns_t columns_local;
  FILE *fp_local;
  
  if (item != (poptItem)0x0) {
    pcStack_30 = translation_domain;
    ppStack_20 = item;
    for (opt._4_4_ = 0; opt._4_4_ < nitems; opt._4_4_ = opt._4_4_ + 1) {
      if (((ppStack_20->option).argInfo & _poptArgMask) == 6) {
        pcStack_30 = (char *)(ppStack_20->option).arg;
      }
      else if ((((ppStack_20->option).longName != (char *)0x0) ||
               ((ppStack_20->option).shortName != '\0')) &&
              (((ppStack_20->option).argInfo & 0x40000000) == 0)) {
        sVar1 = singleOptionUsage(fp,columns,&ppStack_20->option,pcStack_30);
        columns->cur = sVar1;
      }
      ppStack_20 = ppStack_20 + 1;
    }
  }
  return columns->cur;
}

Assistant:

static size_t itemUsage(FILE * fp, columns_t columns,
		poptItem item, int nitems,
		const char * translation_domain)
{
    int i;

    if (item != NULL)
    for (i = 0; i < nitems; i++, item++) {
	const struct poptOption * opt;
	opt = &item->option;
        if (poptArgType(opt) == POPT_ARG_INTL_DOMAIN) {
	    translation_domain = (const char *)opt->arg;
	} else
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN)) {
	    columns->cur = singleOptionUsage(fp, columns, opt, translation_domain);
	}
    }

    return columns->cur;
}